

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_trim(char *dest,int dest_sz,char *src,char *trim)

{
  bool bVar1;
  int iVar2;
  int local_50;
  _Bool trim_it;
  char *pcStack_48;
  char sch;
  char *t;
  int i;
  int offset;
  int var__b;
  int var__a;
  int len;
  char *trim_local;
  char *src_local;
  int dest_sz_local;
  char *dest_local;
  
  iVar2 = sx_strlen(src);
  local_50 = dest_sz + -1;
  if (iVar2 < local_50) {
    local_50 = iVar2;
  }
  t._4_4_ = 0;
  t._0_4_ = 0;
  do {
    if (local_50 <= (int)t) {
      dest[t._4_4_] = '\0';
      return dest;
    }
    bVar1 = false;
    for (pcStack_48 = trim; *pcStack_48 != '\0'; pcStack_48 = pcStack_48 + 1) {
      if (src[(int)t] == *pcStack_48) {
        bVar1 = true;
        break;
      }
    }
    if (!bVar1) {
      dest[t._4_4_] = src[(int)t];
      t._4_4_ = t._4_4_ + 1;
    }
    t._0_4_ = (int)t + 1;
  } while( true );
}

Assistant:

char* sx_trim(char* dest, int dest_sz, const char* src, const char* trim)
{
    int len = sx_min(sx_strlen(src), dest_sz - 1);
    int offset = 0;
    for (int i = 0; i < len; i++) {
        const char* t = trim;
        char sch = src[i];
        bool trim_it = false;
        while (*t) {
            if (sch != *t) {
                ++t;
                continue;
            }
            trim_it = true;
            break;
        }

        if (!trim_it)
            dest[offset++] = src[i];
    }
    dest[offset] = '\0';
    return dest;
}